

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall higan::Buffer::CopyExDataToBuffer(Buffer *this,char *exbuffer,size_t ex_len)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  reference __result;
  size_type sVar5;
  size_t drop_len;
  size_t ex_len_local;
  char *exbuffer_local;
  Buffer *this_local;
  
  uVar1 = this->read_idx_ - 8;
  if (uVar1 < ex_len) {
    sVar5 = std::vector<char,_std::allocator<char>_>::size(&this->buffer_);
    std::vector<char,_std::allocator<char>_>::resize(&this->buffer_,sVar5 + ex_len);
  }
  else {
    pcVar2 = ReadBegin(this);
    pcVar3 = ReadBegin(this);
    sVar4 = ReadableSize(this);
    __result = std::vector<char,_std::allocator<char>_>::operator[](&this->buffer_,8);
    std::copy<char*,char*>(pcVar2,pcVar3 + sVar4,__result);
    this->write_idx_ = this->write_idx_ - uVar1;
    this->read_idx_ = 8;
  }
  pcVar2 = WriteBegin(this);
  std::copy<char_const*,char*>(exbuffer,exbuffer + ex_len,pcVar2);
  AddWriteIndex(this,ex_len);
  return;
}

Assistant:

void Buffer::CopyExDataToBuffer(const char* exbuffer, size_t ex_len)
{

	size_t drop_len = read_idx_ - DEFAULT_READ_INDEX;
	/**
	 * 可以将已读的内容丢弃来 从远buffer_中得到足够的空间
	 * 无法得到则扩容
	 */
	if (drop_len >= ex_len)
	{
		std::copy(ReadBegin(), ReadBegin() + ReadableSize(), &buffer_[DEFAULT_READ_INDEX]);

		write_idx_ -= drop_len;
		read_idx_ = DEFAULT_READ_INDEX;
	}
	else
	{
		buffer_.resize(buffer_.size() + ex_len);
	}

	std::copy(exbuffer, exbuffer + ex_len, WriteBegin());
	AddWriteIndex(ex_len);
}